

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O1

int32_t uprv_stableBinarySearch_63
                  (char *array,int32_t limit,void *item,int32_t itemSize,UComparator *cmp,
                  void *context)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  bVar1 = false;
  if (limit < 9) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    bVar1 = false;
    do {
      uVar6 = (int)(uVar5 + limit) / 2;
      iVar3 = (*cmp)(context,item,array + (int)(uVar6 * itemSize));
      uVar7 = uVar6;
      if (-1 < iVar3) {
        uVar7 = limit;
        uVar5 = uVar6;
      }
      if (iVar3 == 0) {
        bVar1 = true;
        uVar7 = limit;
        uVar5 = uVar6 + 1;
      }
      limit = uVar7;
    } while (8 < (int)(limit - uVar5));
  }
  do {
    if (limit <= (int)uVar5) break;
    iVar3 = (*cmp)(context,item,array + (int)(uVar5 * itemSize));
    bVar4 = true;
    bVar2 = true;
    if ((iVar3 == 0) || (bVar2 = bVar1, -1 < iVar3)) {
      bVar1 = bVar2;
      uVar5 = uVar5 + 1;
    }
    else {
      bVar4 = false;
    }
  } while (bVar4);
  uVar7 = ~uVar5;
  if (bVar1) {
    uVar7 = uVar5 - 1;
  }
  return uVar7;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_stableBinarySearch(char *array, int32_t limit, void *item, int32_t itemSize,
                        UComparator *cmp, const void *context) {
    int32_t start=0;
    UBool found=FALSE;

    /* Binary search until we get down to a tiny sub-array. */
    while((limit-start)>=MIN_QSORT) {
        int32_t i=(start+limit)/2;
        int32_t diff=cmp(context, item, array+i*itemSize);
        if(diff==0) {
            /*
             * Found the item. We look for the *last* occurrence of such
             * an item, for stable sorting.
             * If we knew that there will be only few equal items,
             * we could break now and enter the linear search.
             * However, if there are many equal items, then it should be
             * faster to continue with the binary search.
             * It seems likely that we either have all unique items
             * (where found will never become TRUE in the insertion sort)
             * or potentially many duplicates.
             */
            found=TRUE;
            start=i+1;
        } else if(diff<0) {
            limit=i;
        } else {
            start=i;
        }
    }

    /* Linear search over the remaining tiny sub-array. */
    while(start<limit) {
        int32_t diff=cmp(context, item, array+start*itemSize);
        if(diff==0) {
            found=TRUE;
        } else if(diff<0) {
            break;
        }
        ++start;
    }
    return found ? (start-1) : ~start;
}